

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo-vm.c
# Opt level: O0

_Bool callValue(Value callee,int argCount)

{
  _Bool _Var1;
  Value *value;
  ObjInstance *pOVar2;
  Value value_00;
  uint in_ESI;
  ulong in_RDI;
  Value result;
  NativeFn native;
  Value initializer;
  ObjClass *classObj;
  ObjBoundMethod *bound;
  ObjString *in_stack_ffffffffffffffc0;
  int argCount_00;
  ObjClosure *in_stack_ffffffffffffffc8;
  _Bool local_1;
  
  if ((in_RDI & 0xfffc000000000000) == 0xfffc000000000000) {
    value = (Value *)(ulong)*(uint *)(in_RDI & 0x3ffffffffffff);
    argCount_00 = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
    switch(value) {
    case (Value *)0x0:
      vm.stackTop[(int)(-1 - in_ESI)] = *(Value *)((in_RDI & 0x3ffffffffffff) + 0x10);
      local_1 = call(in_stack_ffffffffffffffc8,argCount_00);
      break;
    case (Value *)0x1:
      pOVar2 = newInstance((ObjClass *)in_stack_ffffffffffffffc0);
      vm.stackTop[(int)(-1 - in_ESI)] = (ulong)pOVar2 | 0xfffc000000000000;
      _Var1 = tableGet((Table *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,value);
      if (_Var1) {
        local_1 = call(in_stack_ffffffffffffffc8,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
      }
      else if (in_ESI == 0) {
        local_1 = true;
      }
      else {
        runtimeError("Expected 0 arguments but got %d.",(ulong)in_ESI);
        local_1 = false;
      }
      break;
    case (Value *)0x2:
      local_1 = call(in_stack_ffffffffffffffc8,argCount_00);
      break;
    default:
      goto LAB_00103ee9;
    case (Value *)0x5:
      value_00 = (**(code **)((in_RDI & 0x3ffffffffffff) + 0x10))
                           (in_ESI,vm.stackTop + -(long)(int)in_ESI);
      vm.stackTop = vm.stackTop + -(long)(int)(in_ESI + 1);
      push(value_00);
      local_1 = true;
    }
  }
  else {
LAB_00103ee9:
    runtimeError("Can only call functions and classes.");
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool callValue(Value callee, int argCount) {
    if (IS_OBJ(callee)) {
        switch (OBJ_TYPE(callee)) {
            case OBJ_BOUND_METHOD: {
                ObjBoundMethod* bound = AS_BOUND_METHOD(callee);
                vm.stackTop[-argCount - 1] = bound->receiver;
                return call(bound->method, argCount);
            }
            case OBJ_CLASS: {
                ObjClass* classObj = AS_CLASS(callee);
                vm.stackTop[-argCount - 1] = OBJ_VAL(newInstance(classObj));
                Value initializer;
                if (tableGet(&classObj->methods, vm.initString, &initializer)) {
                    return call(AS_CLOSURE(initializer), argCount);
                }else if (argCount != 0) {
                    runtimeError("Expected 0 arguments but got %d.", argCount);
                    return false;
                }
                return true;
            }
            case OBJ_CLOSURE:{
                return call(AS_CLOSURE(callee),argCount);
            }
            case OBJ_NATIVE: {
                NativeFn native = AS_NATIVE(callee);
                Value result = native(argCount, vm.stackTop - argCount);
                vm.stackTop -= argCount + 1;
                push(result);
                return true;
            }
            default:
                // Non-callable object type.
                break;
        }
    }

    runtimeError("Can only call functions and classes.");
    return false;
}